

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O3

int blake2b_init_key(blake2b_state *S,uint8_t outlen,void *key,uint8_t keylen)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint64_t uVar8;
  int iVar9;
  long lVar10;
  uint8_t block [128];
  undefined4 local_e8;
  uint auStack_e4 [15];
  uint8_t local_a8 [136];
  
  iVar9 = -1;
  if ((0xbf < (byte)(outlen + 0xbf)) && (0xbf < (byte)(keylen + 0xbf) && key != (void *)0x0)) {
    local_e8._2_2_ = 0x101;
    auStack_e4[0] = 0;
    auStack_e4[1] = 0;
    auStack_e4[2] = 0;
    auStack_e4[3] = 0;
    auStack_e4[4] = 0;
    auStack_e4[5] = 0;
    auStack_e4[6] = 0;
    auStack_e4[7] = 0;
    auStack_e4[8] = 0;
    auStack_e4[9] = 0;
    auStack_e4[10] = 0;
    auStack_e4[0xb] = 0;
    auStack_e4[0xc] = 0;
    auStack_e4[0xd] = 0;
    auStack_e4[0xe] = 0;
    lVar10 = 0;
    local_e8._0_1_ = outlen;
    local_e8._1_1_ = keylen;
    memset(S->t,0,0x140);
    S->h[0] = 0x6a09e667f3bcc908;
    S->h[1] = 0xbb67ae8584caa73b;
    S->h[2] = 0x3c6ef372fe94f82b;
    S->h[3] = 0xa54ff53a5f1d36f1;
    S->h[4] = 0x510e527fade682d1;
    S->h[5] = 0x9b05688c2b3e6c1f;
    S->h[6] = 0x1f83d9abfb41bd6b;
    S->h[7] = 0x5be0cd19137e2179;
    do {
      puVar1 = S->h + lVar10;
      uVar3 = *(uint *)((long)puVar1 + 4);
      uVar8 = puVar1[1];
      uVar4 = *(uint *)((long)puVar1 + 0xc);
      uVar5 = auStack_e4[lVar10 * 2];
      uVar6 = auStack_e4[lVar10 * 2 + 1];
      uVar7 = auStack_e4[lVar10 * 2 + 2];
      puVar2 = S->h + lVar10;
      *(uint *)puVar2 = (uint)*puVar1 ^ (&local_e8)[lVar10 * 2];
      *(uint *)((long)puVar2 + 4) = uVar3 ^ uVar5;
      *(uint *)(puVar2 + 1) = (uint)uVar8 ^ uVar6;
      *(uint *)((long)puVar2 + 0xc) = uVar4 ^ uVar7;
      lVar10 = lVar10 + 2;
    } while (lVar10 != 8);
    local_a8[0x70] = '\0';
    local_a8[0x71] = '\0';
    local_a8[0x72] = '\0';
    local_a8[0x73] = '\0';
    local_a8[0x74] = '\0';
    local_a8[0x75] = '\0';
    local_a8[0x76] = '\0';
    local_a8[0x77] = '\0';
    local_a8[0x78] = '\0';
    local_a8[0x79] = '\0';
    local_a8[0x7a] = '\0';
    local_a8[0x7b] = '\0';
    local_a8[0x7c] = '\0';
    local_a8[0x7d] = '\0';
    local_a8[0x7e] = '\0';
    local_a8[0x7f] = '\0';
    local_a8[0x60] = '\0';
    local_a8[0x61] = '\0';
    local_a8[0x62] = '\0';
    local_a8[99] = '\0';
    local_a8[100] = '\0';
    local_a8[0x65] = '\0';
    local_a8[0x66] = '\0';
    local_a8[0x67] = '\0';
    local_a8[0x68] = '\0';
    local_a8[0x69] = '\0';
    local_a8[0x6a] = '\0';
    local_a8[0x6b] = '\0';
    local_a8[0x6c] = '\0';
    local_a8[0x6d] = '\0';
    local_a8[0x6e] = '\0';
    local_a8[0x6f] = '\0';
    local_a8[0x50] = '\0';
    local_a8[0x51] = '\0';
    local_a8[0x52] = '\0';
    local_a8[0x53] = '\0';
    local_a8[0x54] = '\0';
    local_a8[0x55] = '\0';
    local_a8[0x56] = '\0';
    local_a8[0x57] = '\0';
    local_a8[0x58] = '\0';
    local_a8[0x59] = '\0';
    local_a8[0x5a] = '\0';
    local_a8[0x5b] = '\0';
    local_a8[0x5c] = '\0';
    local_a8[0x5d] = '\0';
    local_a8[0x5e] = '\0';
    local_a8[0x5f] = '\0';
    local_a8[0x40] = '\0';
    local_a8[0x41] = '\0';
    local_a8[0x42] = '\0';
    local_a8[0x43] = '\0';
    local_a8[0x44] = '\0';
    local_a8[0x45] = '\0';
    local_a8[0x46] = '\0';
    local_a8[0x47] = '\0';
    local_a8[0x48] = '\0';
    local_a8[0x49] = '\0';
    local_a8[0x4a] = '\0';
    local_a8[0x4b] = '\0';
    local_a8[0x4c] = '\0';
    local_a8[0x4d] = '\0';
    local_a8[0x4e] = '\0';
    local_a8[0x4f] = '\0';
    local_a8[0x30] = '\0';
    local_a8[0x31] = '\0';
    local_a8[0x32] = '\0';
    local_a8[0x33] = '\0';
    local_a8[0x34] = '\0';
    local_a8[0x35] = '\0';
    local_a8[0x36] = '\0';
    local_a8[0x37] = '\0';
    local_a8[0x38] = '\0';
    local_a8[0x39] = '\0';
    local_a8[0x3a] = '\0';
    local_a8[0x3b] = '\0';
    local_a8[0x3c] = '\0';
    local_a8[0x3d] = '\0';
    local_a8[0x3e] = '\0';
    local_a8[0x3f] = '\0';
    local_a8[0x20] = '\0';
    local_a8[0x21] = '\0';
    local_a8[0x22] = '\0';
    local_a8[0x23] = '\0';
    local_a8[0x24] = '\0';
    local_a8[0x25] = '\0';
    local_a8[0x26] = '\0';
    local_a8[0x27] = '\0';
    local_a8[0x28] = '\0';
    local_a8[0x29] = '\0';
    local_a8[0x2a] = '\0';
    local_a8[0x2b] = '\0';
    local_a8[0x2c] = '\0';
    local_a8[0x2d] = '\0';
    local_a8[0x2e] = '\0';
    local_a8[0x2f] = '\0';
    local_a8[0x10] = '\0';
    local_a8[0x11] = '\0';
    local_a8[0x12] = '\0';
    local_a8[0x13] = '\0';
    local_a8[0x14] = '\0';
    local_a8[0x15] = '\0';
    local_a8[0x16] = '\0';
    local_a8[0x17] = '\0';
    local_a8[0x18] = '\0';
    local_a8[0x19] = '\0';
    local_a8[0x1a] = '\0';
    local_a8[0x1b] = '\0';
    local_a8[0x1c] = '\0';
    local_a8[0x1d] = '\0';
    local_a8[0x1e] = '\0';
    local_a8[0x1f] = '\0';
    local_a8[0] = '\0';
    local_a8[1] = '\0';
    local_a8[2] = '\0';
    local_a8[3] = '\0';
    local_a8[4] = '\0';
    local_a8[5] = '\0';
    local_a8[6] = '\0';
    local_a8[7] = '\0';
    local_a8[8] = '\0';
    local_a8[9] = '\0';
    local_a8[10] = '\0';
    local_a8[0xb] = '\0';
    local_a8[0xc] = '\0';
    local_a8[0xd] = '\0';
    local_a8[0xe] = '\0';
    local_a8[0xf] = '\0';
    memcpy(local_a8,key,(ulong)keylen);
    blake2b_update(S,local_a8,0x80);
    lVar10 = 0;
    do {
      local_a8[lVar10] = '\0';
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x80);
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

int blake2b_init_key( blake2b_state *S, const uint8_t outlen, const void *key, const uint8_t keylen )
{
  blake2b_param P[1];

  if ( ( !outlen ) || ( outlen > BLAKE2B_OUTBYTES ) ) return -1;

  if ( !key || !keylen || keylen > BLAKE2B_KEYBYTES ) return -1;

  P->digest_length = outlen;
  P->key_length    = keylen;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store64( &P->node_offset, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  memset( P->reserved, 0, sizeof( P->reserved ) );
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );

  if( blake2b_init_param( S, P ) < 0 ) return -1;

  {
    uint8_t block[BLAKE2B_BLOCKBYTES];
    memset( block, 0, BLAKE2B_BLOCKBYTES );
    memcpy( block, key, keylen );
    blake2b_update( S, block, BLAKE2B_BLOCKBYTES );
    secure_zero_memory( block, BLAKE2B_BLOCKBYTES ); /* Burn the key from stack */
  }
  return 0;
}